

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::OptNonGreedy
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this)

{
  EncodedChar EVar1;
  
  EVar1 = ECLookahead(this,0);
  if (EVar1 == '?') {
    ECConsume(this,1);
  }
  return EVar1 != '?';
}

Assistant:

bool Parser<P, IsLiteral>::OptNonGreedy()
    {
        // Could be terminating 0
        if (ECLookahead() != '?')
            return true;
        ECConsume();
        return false;
    }